

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParseFieldValueFromString
          (Parser *this,string_view input,FieldDescriptor *field,Message *output)

{
  bool bVar1;
  const_pointer data;
  size_type sVar2;
  Descriptor *root_message_type;
  undefined1 local_188 [8];
  ParserImpl parser;
  ArrayInputStream input_stream;
  Message *output_local;
  FieldDescriptor *field_local;
  Parser *this_local;
  string_view input_local;
  
  input_local._M_len = (size_t)input._M_str;
  this_local = (Parser *)input._M_len;
  data = std::basic_string_view<char,_std::char_traits<char>_>::data
                   ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  io::ArrayInputStream::ArrayInputStream
            ((ArrayInputStream *)&parser.no_op_fields_,data,(int)sVar2,-1);
  root_message_type = Message::GetDescriptor(output);
  ParserImpl::ParserImpl
            ((ParserImpl *)local_188,root_message_type,(ZeroCopyInputStream *)&parser.no_op_fields_,
             this->error_collector_,this->finder_,this->parse_info_tree_,ALLOW_SINGULAR_OVERWRITES,
             (bool)(this->allow_case_insensitive_field_ & 1),(bool)(this->allow_unknown_field_ & 1),
             (bool)(this->allow_unknown_extension_ & 1),(bool)(this->allow_unknown_enum_ & 1),
             (bool)(this->allow_field_number_ & 1),(bool)(this->allow_relaxed_whitespace_ & 1),
             (bool)(this->allow_partial_ & 1),this->recursion_limit_,this->no_op_fields_);
  bVar1 = ParserImpl::ParseField((ParserImpl *)local_188,field,output);
  ParserImpl::~ParserImpl((ParserImpl *)local_188);
  io::ArrayInputStream::~ArrayInputStream((ArrayInputStream *)&parser.no_op_fields_);
  return bVar1;
}

Assistant:

bool TextFormat::Parser::ParseFieldValueFromString(absl::string_view input,
                                                   const FieldDescriptor* field,
                                                   Message* output) {
  io::ArrayInputStream input_stream(input.data(), input.size());
  ParserImpl parser(output->GetDescriptor(), &input_stream, error_collector_,
                    finder_, parse_info_tree_,
                    ParserImpl::ALLOW_SINGULAR_OVERWRITES,
                    allow_case_insensitive_field_, allow_unknown_field_,
                    allow_unknown_extension_, allow_unknown_enum_,
                    allow_field_number_, allow_relaxed_whitespace_,
                    allow_partial_, recursion_limit_, no_op_fields_);
  return parser.ParseField(field, output);
}